

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vic20.cpp
# Opt level: O0

void __thiscall Commodore::Vic20::Joystick::~Joystick(Joystick *this)

{
  Joystick *this_local;
  
  ~Joystick(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

Joystick(UserPortVIA &user_port_via_port_handler, KeyboardVIA &keyboard_via_port_handler) :
			ConcreteJoystick({
				Input(Input::Up),
				Input(Input::Down),
				Input(Input::Left),
				Input(Input::Right),
				Input(Input::Fire)
			}),
			user_port_via_port_handler_(user_port_via_port_handler),
			keyboard_via_port_handler_(keyboard_via_port_handler) {}